

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_td(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  _Bool _Var1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGTemp *local_38;
  long local_30;
  long local_28;
  TCGTemp *local_20;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  _Var1 = check_unconditional_trap(ctx);
  if (!_Var1) {
    pTVar2 = tcg_const_i32_ppc64(tcg_ctx,ctx->opcode >> 0x15 & 0x1f);
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_30 = (long)&tcg_ctx->pool_cur +
               *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
    local_28 = (long)&tcg_ctx->pool_cur +
               *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    local_20 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_td,(TCGTemp *)0x0,4,&local_38);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  }
  return;
}

Assistant:

static void gen_td(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;

    if (check_unconditional_trap(ctx)) {
        return;
    }
    t0 = tcg_const_i32(tcg_ctx, TO(ctx->opcode));
    gen_helper_td(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)],
                  t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}